

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Caliper.cpp
# Opt level: O3

Channel __thiscall cali::Caliper::get_channel(Caliper *this,cali_id_t id)

{
  int *piVar1;
  undefined8 *puVar2;
  GlobalData *pGVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  undefined8 *puVar4;
  undefined8 *puVar5;
  long lVar6;
  ulong uVar7;
  Channel CVar8;
  Channel CVar9;
  Channel CVar10;
  
  puVar5 = *(undefined8 **)(*(long *)(id + 8) + 0x8100);
  puVar2 = *(undefined8 **)(*(long *)(id + 8) + 0x8108);
  uVar7 = (long)puVar2 - (long)puVar5;
  if (0 < (long)uVar7 >> 6) {
    puVar4 = (undefined8 *)((uVar7 & 0xffffffffffffffc0) + (long)puVar5);
    lVar6 = ((long)uVar7 >> 6) + 1;
    puVar5 = puVar5 + 4;
    do {
      if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)puVar5[-4] == in_RDX._M_pi) {
        puVar5 = puVar5 + -4;
        goto LAB_001e1c56;
      }
      if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)puVar5[-2] == in_RDX._M_pi) {
        puVar5 = puVar5 + -2;
        goto LAB_001e1c56;
      }
      if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)*puVar5 == in_RDX._M_pi)
      goto LAB_001e1c56;
      if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)puVar5[2] == in_RDX._M_pi) {
        puVar5 = puVar5 + 2;
        goto LAB_001e1c56;
      }
      lVar6 = lVar6 + -1;
      puVar5 = puVar5 + 8;
    } while (1 < lVar6);
    uVar7 = (long)puVar2 - (long)puVar4;
    puVar5 = puVar4;
  }
  lVar6 = (long)uVar7 >> 4;
  if (lVar6 == 1) {
LAB_001e1c37:
    if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)*puVar5 != in_RDX._M_pi) {
      puVar5 = puVar2;
    }
  }
  else if (lVar6 == 2) {
LAB_001e1c2b:
    if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)*puVar5 != in_RDX._M_pi) {
      puVar5 = puVar5 + 2;
      goto LAB_001e1c37;
    }
  }
  else {
    if (lVar6 != 3) goto LAB_001e1c7e;
    if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)*puVar5 != in_RDX._M_pi) {
      puVar5 = puVar5 + 2;
      goto LAB_001e1c2b;
    }
  }
LAB_001e1c56:
  if (puVar5 != puVar2) {
    (this->super_CaliperMetadataAccessInterface)._vptr_CaliperMetadataAccessInterface =
         (_func_int **)*puVar5;
    pGVar3 = (GlobalData *)puVar5[1];
    this->sG = pGVar3;
    if (pGVar3 != (GlobalData *)0x0) {
      in_RDX._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
      if (__libc_single_threaded != '\0') {
        piVar1 = &(pGVar3->attribute_lock).super___mutex_base._M_mutex.__data.__owner;
        *piVar1 = *piVar1 + 1;
        CVar8.mP.super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
        CVar8.mP.super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)this;
        return (Channel)CVar8.mP.super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>;
      }
      LOCK();
      piVar1 = &(pGVar3->attribute_lock).super___mutex_base._M_mutex.__data.__owner;
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    CVar10.mP.super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         in_RDX._M_pi;
    CVar10.mP.super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (Channel)CVar10.mP.super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>;
  }
LAB_001e1c7e:
  (this->super_CaliperMetadataAccessInterface)._vptr_CaliperMetadataAccessInterface =
       (_func_int **)0x0;
  this->sG = (GlobalData *)0x0;
  CVar9.mP.super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  CVar9.mP.super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Channel)CVar9.mP.super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Channel Caliper::get_channel(cali_id_t id)
{
    auto it = std::find_if(sG->all_channels.begin(), sG->all_channels.end(), [id](const Channel& channel) {
        return id == channel.id();
    });

    return it == sG->all_channels.end() ? Channel() : *it;
}